

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O3

int bgzf_getline(BGZF *fp,int delim,kstring_t *str)

{
  void *pvVar1;
  hFILE *phVar2;
  long lVar3;
  int iVar4;
  char *__ptr;
  int iVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  size_t sVar9;
  long lVar10;
  size_t __size;
  size_t __n;
  bool bVar11;
  
  pvVar1 = fp->uncompressed_block;
  str->l = 0;
  iVar4 = fp->block_length;
  iVar5 = fp->block_offset;
  do {
    if (iVar4 <= iVar5) {
      iVar4 = bgzf_read_block(fp);
      if (iVar4 == 0) {
        iVar4 = fp->block_length;
        if (iVar4 != 0) {
          iVar5 = fp->block_offset;
          goto LAB_0013d730;
        }
        iVar4 = -1;
      }
      else {
        iVar4 = -2;
      }
      sVar9 = str->l;
      if (sVar9 == 0) {
        return iVar4;
      }
      bVar11 = false;
      goto LAB_0013d872;
    }
LAB_0013d730:
    iVar6 = iVar5;
    if (iVar5 < iVar4) {
      lVar10 = (long)iVar5;
      bVar11 = true;
      if ((uint)*(byte *)((long)pvVar1 + lVar10) != delim) {
        lVar7 = 0;
        do {
          if ((1 - iVar4) + iVar5 + (int)lVar7 == 0) {
            bVar11 = lVar7 + lVar10 + 1 < (long)iVar4;
            iVar6 = iVar4;
            goto LAB_0013d799;
          }
          lVar3 = lVar7 + lVar10 + 1;
          lVar7 = lVar7 + 1;
        } while ((uint)*(byte *)((long)pvVar1 + lVar3) != delim);
        bVar11 = lVar10 + lVar7 < (long)iVar4;
        iVar6 = (int)lVar7 + iVar5;
      }
    }
    else {
      bVar11 = false;
    }
LAB_0013d799:
    iVar6 = iVar6 - iVar5;
    sVar9 = str->l;
    __ptr = str->s;
    __n = (size_t)iVar6;
    uVar8 = __n + sVar9 + 1;
    if (str->m <= uVar8) {
      uVar8 = uVar8 >> 1 | uVar8;
      uVar8 = uVar8 >> 2 | uVar8;
      uVar8 = uVar8 >> 4 | uVar8;
      uVar8 = uVar8 >> 8 | uVar8;
      __size = (uVar8 >> 0x10 | uVar8) + 1;
      str->m = __size;
      __ptr = (char *)realloc(__ptr,__size);
      str->s = __ptr;
      sVar9 = str->l;
      iVar5 = fp->block_offset;
    }
    memcpy(__ptr + sVar9,(void *)((long)iVar5 + (long)pvVar1),__n);
    sVar9 = str->l + __n;
    str->l = sVar9;
    iVar4 = fp->block_length;
    iVar5 = fp->block_offset + iVar6 + 1;
    fp->block_offset = iVar5;
    if (iVar4 <= iVar5) {
      phVar2 = fp->fp;
      fp->block_address = (int64_t)(phVar2->begin + (phVar2->offset - (long)phVar2->buffer));
      fp->block_length = 0;
      fp->block_offset = 0;
      iVar4 = 0;
      iVar5 = 0;
    }
  } while (!bVar11);
  bVar11 = sVar9 == 0;
LAB_0013d872:
  fp->uncompressed_address = fp->uncompressed_address + sVar9;
  if (((delim == 10) && (!bVar11)) && (str->s[sVar9 - 1] == '\r')) {
    sVar9 = sVar9 - 1;
    str->l = sVar9;
  }
  str->s[sVar9] = '\0';
  return (int)str->l;
}

Assistant:

int bgzf_getline(BGZF *fp, int delim, kstring_t *str)
{
    int l, state = 0;
    unsigned char *buf = (unsigned char*)fp->uncompressed_block;
    str->l = 0;
    do {
        if (fp->block_offset >= fp->block_length) {
            if (bgzf_read_block(fp) != 0) { state = -2; break; }
            if (fp->block_length == 0) { state = -1; break; }
        }
        for (l = fp->block_offset; l < fp->block_length && buf[l] != delim; ++l);
        if (l < fp->block_length) state = 1;
        l -= fp->block_offset;
        if (str->l + l + 1 >= str->m) {
            str->m = str->l + l + 2;
            kroundup32(str->m);
            str->s = (char*)realloc(str->s, str->m);
        }
        memcpy(str->s + str->l, buf + fp->block_offset, l);
        str->l += l;
        fp->block_offset += l + 1;
        if (fp->block_offset >= fp->block_length) {
            fp->block_address = htell(fp->fp);
            fp->block_offset = 0;
            fp->block_length = 0;
        }
    } while (state == 0);
    if (str->l == 0 && state < 0) return state;
    fp->uncompressed_address += str->l;
    if ( delim=='\n' && str->l>0 && str->s[str->l-1]=='\r' ) str->l--;
    str->s[str->l] = 0;
    return str->l;
}